

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_135799e::ResizeInternalTestLarge::PreEncodeFrameHook
          (ResizeInternalTestLarge *this,VideoSource *video,Encoder *encoder)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  aom_scaling_mode in_RAX;
  aom_scaling_mode mode;
  
  bVar1 = this->change_config_;
  mode = in_RAX;
  uVar2 = (*video->_vptr_VideoSource[8])(video);
  if (bVar1 == true) {
    if (uVar2 != 0) {
      iVar3 = (*video->_vptr_VideoSource[8])(video);
      if (iVar3 != 1) {
        return;
      }
      mode.h_scaling_mode = AOME_NORMAL;
      mode.v_scaling_mode = AOME_NORMAL;
      libaom_test::Encoder::Control(encoder,0xb,&mode);
      (this->super_ResizeTest).super_EncoderTest.cfg_.rc_min_quantizer = 0x3c;
      (this->super_ResizeTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3c;
      libaom_test::Encoder::Config(encoder,&(this->super_ResizeTest).super_EncoderTest.cfg_);
      return;
    }
    mode.h_scaling_mode = AOME_ONETWO;
    mode.v_scaling_mode = AOME_ONETWO;
  }
  else {
    if ((2 < uVar2) && (uVar2 = (*video->_vptr_VideoSource[8])(video), uVar2 < 6)) {
      mode.h_scaling_mode = AOME_FOURFIVE;
      mode.v_scaling_mode = AOME_THREEFIVE;
      libaom_test::Encoder::Control(encoder,0xb,&mode);
    }
    uVar2 = (*video->_vptr_VideoSource[8])(video);
    if (uVar2 < 6) {
      return;
    }
    mode.h_scaling_mode = AOME_NORMAL;
    mode.v_scaling_mode = AOME_NORMAL;
  }
  libaom_test::Encoder::Control(encoder,0xb,&mode);
  return;
}

Assistant:

void PreEncodeFrameHook(libaom_test::VideoSource *video,
                          libaom_test::Encoder *encoder) override {
    if (change_config_) {
      int new_q = 60;
      if (video->frame() == 0) {
        struct aom_scaling_mode mode = { AOME_ONETWO, AOME_ONETWO };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
      } else if (video->frame() == 1) {
        struct aom_scaling_mode mode = { AOME_NORMAL, AOME_NORMAL };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
        cfg_.rc_min_quantizer = cfg_.rc_max_quantizer = new_q;
        encoder->Config(&cfg_);
      }
    } else {
      if (video->frame() >= kStepDownFrame && video->frame() < kStepUpFrame) {
        struct aom_scaling_mode mode = { AOME_FOURFIVE, AOME_THREEFIVE };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
      }
      if (video->frame() >= kStepUpFrame) {
        struct aom_scaling_mode mode = { AOME_NORMAL, AOME_NORMAL };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
      }
    }
  }